

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                  void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                  float scale_max,ImVec2 frame_size)

{
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiID id_00;
  ImU32 IVar3;
  int iVar4;
  ImU32 IVar5;
  int iVar6;
  ImGuiWindow *this;
  int iVar7;
  int iVar8;
  ImGuiCol IVar9;
  float fVar10;
  float fVar11;
  ImU32 local_214;
  ImU32 local_204;
  float local_1d4;
  float local_1c4;
  float local_19c;
  ImVec2 local_16c;
  ImVec2 local_164;
  ImVec2 local_15c;
  ImVec2 local_154;
  ImVec2 local_14c;
  ImVec2 pos1;
  ImVec2 pos0;
  ImVec2 tp1;
  float v1_1;
  int v1_idx;
  float t1;
  int n;
  ImU32 col_hovered;
  ImU32 col_base;
  float histogram_zero_line_t;
  ImVec2 tp0;
  float t0;
  float v0;
  float inv_scale;
  float t_step;
  float v1;
  float v0_1;
  int v_idx;
  float t;
  int v_hovered;
  int item_count;
  int res_w;
  int values_count_min;
  int local_cc;
  float v;
  int i;
  float v_max;
  float v_min;
  bool hovered;
  ImVec2 local_b4;
  undefined1 local_ac [8];
  ImRect total_bb;
  ImVec2 local_94;
  undefined1 local_8c [8];
  ImRect inner_bb;
  undefined1 local_74 [8];
  ImRect frame_bb;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  float scale_max_local;
  float scale_min_local;
  int values_offset_local;
  int values_count_local;
  void *data_local;
  _func_float_void_ptr_int *values_getter_local;
  char *label_local;
  float fStack_10;
  ImGuiPlotType plot_type_local;
  ImVec2 frame_size_local;
  
  _fStack_10 = frame_size;
  this = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((this->SkipItems & 1U) == 0) {
    id_00 = ImGuiWindow::GetID(this,label,(char *)0x0);
    frame_bb.Max = CalcTextSize(label,(char *)0x0,true,-1.0);
    if ((fStack_10 == 0.0) && (!NAN(fStack_10))) {
      fVar10 = CalcItemWidth();
      fStack_10 = fVar10;
    }
    if (((float)plot_type_local == 0.0) && (!NAN((float)plot_type_local))) {
      fVar10 = (pIVar1->Style).FramePadding.y;
      plot_type_local = (ImGuiPlotType)(fVar10 + fVar10 + frame_bb.Max.y);
    }
    inner_bb.Max = operator+(&(this->DC).CursorPos,(ImVec2 *)&stack0xfffffffffffffff0);
    ImRect::ImRect((ImRect *)local_74,&(this->DC).CursorPos,&inner_bb.Max);
    local_94 = operator+((ImVec2 *)local_74,&(pIVar1->Style).FramePadding);
    total_bb.Max = operator-(&frame_bb.Min,&(pIVar1->Style).FramePadding);
    ImRect::ImRect((ImRect *)local_8c,&local_94,&total_bb.Max);
    if (frame_bb.Max.x <= 0.0) {
      local_19c = 0.0;
    }
    else {
      local_19c = (pIVar1->Style).ItemInnerSpacing.x + frame_bb.Max.x;
    }
    ImVec2::ImVec2((ImVec2 *)&v_min,local_19c,0.0);
    local_b4 = operator+(&frame_bb.Min,(ImVec2 *)&v_min);
    ImRect::ImRect((ImRect *)local_ac,(ImVec2 *)local_74,&local_b4);
    ItemSize((ImRect *)local_ac,(pIVar1->Style).FramePadding.y);
    bVar2 = ItemAdd((ImRect *)local_ac,0,(ImRect *)local_74);
    if (bVar2) {
      bVar2 = ItemHoverable((ImRect *)local_74,id_00);
      window._0_4_ = scale_max;
      window._4_4_ = scale_min;
      if (((scale_min == 3.4028235e+38) && (!NAN(scale_min))) ||
         ((scale_max == 3.4028235e+38 && (!NAN(scale_max))))) {
        i = 0x7f7fffff;
        v = -3.4028235e+38;
        for (local_cc = 0; local_cc < values_count; local_cc = local_cc + 1) {
          fVar10 = (*values_getter)(data,local_cc);
          if (!NAN(fVar10)) {
            i = (int)ImMin<float>((float)i,fVar10);
            v = ImMax<float>(v,fVar10);
          }
        }
        if ((scale_min == 3.4028235e+38) && (!NAN(scale_min))) {
          window._4_4_ = (float)i;
        }
        if ((scale_max == 3.4028235e+38) && (!NAN(scale_max))) {
          window._0_4_ = v;
        }
      }
      p_min.y = (float)local_74._4_4_;
      p_min.x = (float)local_74._0_4_;
      p_max.y = frame_bb.Min.y;
      p_max.x = frame_bb.Min.x;
      IVar3 = GetColorU32(7,1.0);
      RenderFrame(p_min,p_max,IVar3,true,(pIVar1->Style).FrameRounding);
      iVar4 = 1;
      if (plot_type == ImGuiPlotType_Lines) {
        iVar4 = 2;
      }
      if (iVar4 <= values_count) {
        iVar4 = ImMin<int>((int)fStack_10,values_count);
        iVar7 = 0;
        if (plot_type == ImGuiPlotType_Lines) {
          iVar7 = -1;
        }
        iVar8 = 0;
        if (plot_type == ImGuiPlotType_Lines) {
          iVar8 = -1;
        }
        v_idx = -1;
        if ((bVar2) && (bVar2 = ImRect::Contains((ImRect *)local_8c,&(pIVar1->IO).MousePos), bVar2))
        {
          fVar10 = ImClamp<float>(((pIVar1->IO).MousePos.x - (float)local_8c._0_4_) /
                                  (inner_bb.Min.x - (float)local_8c._0_4_),0.0,0.9999);
          v_idx = (int)(fVar10 * (float)(values_count + iVar8));
          if (v_idx < 0 || values_count <= v_idx) {
            __assert_fail("v_idx >= 0 && v_idx < values_count",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui_widgets.cpp"
                          ,0x16b4,
                          "void ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                         );
          }
          fVar10 = (*values_getter)(data,(v_idx + values_offset) % values_count);
          fVar11 = (*values_getter)(data,(int)(v_idx + 1U + values_offset) % values_count);
          if (plot_type == ImGuiPlotType_Lines) {
            SetTooltip("%d: %8.4g\n%d: %8.4g",(double)fVar10,SUB84((double)fVar11,0),
                       (ulong)(uint)v_idx,(ulong)(v_idx + 1));
          }
          else if (plot_type == ImGuiPlotType_Histogram) {
            SetTooltip("%d: %8.4g",(double)fVar10,(ulong)(uint)v_idx);
          }
        }
        if ((window._4_4_ != window._0_4_) || (NAN(window._4_4_) || NAN(window._0_4_))) {
          local_1c4 = 1.0 / (window._0_4_ - window._4_4_);
        }
        else {
          local_1c4 = 0.0;
        }
        tp0.y = (*values_getter)(data,values_offset % values_count);
        tp0.x = 0.0;
        fVar10 = ImSaturate((tp0.y - window._4_4_) * local_1c4);
        ImVec2::ImVec2((ImVec2 *)&col_base,0.0,1.0 - fVar10);
        if (0.0 <= window._4_4_ * window._0_4_) {
          local_1d4 = (float)(~-(uint)(window._4_4_ < 0.0) & 0x3f800000);
        }
        else {
          local_1d4 = -window._4_4_ * local_1c4;
        }
        IVar9 = 0x28;
        if (plot_type == ImGuiPlotType_Lines) {
          IVar9 = 0x26;
        }
        IVar3 = GetColorU32(IVar9,1.0);
        IVar9 = 0x29;
        if (plot_type == ImGuiPlotType_Lines) {
          IVar9 = 0x27;
        }
        IVar5 = GetColorU32(IVar9,1.0);
        for (v1_idx = 0; v1_idx < iVar4 + iVar7; v1_idx = v1_idx + 1) {
          fVar10 = tp0.x + 1.0 / (float)(iVar4 + iVar7);
          iVar6 = (int)(tp0.x * (float)(values_count + iVar8) + 0.5);
          if (iVar6 < 0 || values_count <= iVar6) {
            __assert_fail("v1_idx >= 0 && v1_idx < values_count",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui_widgets.cpp"
                          ,0x16ce,
                          "void ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                         );
          }
          fVar11 = (*values_getter)(data,(iVar6 + 1 + values_offset) % values_count);
          fVar11 = ImSaturate((fVar11 - window._4_4_) * local_1c4);
          ImVec2::ImVec2(&pos0,fVar10,1.0 - fVar11);
          pos1 = ImLerp((ImVec2 *)local_8c,&inner_bb.Min,(ImVec2 *)&col_base);
          if (plot_type != ImGuiPlotType_Lines) {
            ImVec2::ImVec2(&local_154,pos0.x,local_1d4);
          }
          local_14c = ImLerp((ImVec2 *)local_8c,&inner_bb.Min,&local_154);
          if (plot_type == ImGuiPlotType_Lines) {
            local_204 = IVar3;
            if (v_idx == iVar6) {
              local_204 = IVar5;
            }
            ImDrawList::AddLine(this->DrawList,&pos1,&local_14c,local_204,1.0);
          }
          else if (plot_type == ImGuiPlotType_Histogram) {
            if (pos1.x + 2.0 <= local_14c.x) {
              local_14c.x = local_14c.x - 1.0;
            }
            local_214 = IVar3;
            if (v_idx == iVar6) {
              local_214 = IVar5;
            }
            ImDrawList::AddRectFilled(this->DrawList,&pos1,&local_14c,local_214,0.0,0xf);
          }
          tp0.x = fVar10;
        }
      }
      if (overlay_text != (char *)0x0) {
        ImVec2::ImVec2(&local_15c,(float)local_74._0_4_,
                       (float)local_74._4_4_ + (pIVar1->Style).FramePadding.y);
        ImVec2::ImVec2(&local_164,0.5,0.0);
        RenderTextClipped(&local_15c,&frame_bb.Min,overlay_text,(char *)0x0,(ImVec2 *)0x0,&local_164
                          ,(ImRect *)0x0);
      }
      if (0.0 < frame_bb.Max.x) {
        ImVec2::ImVec2(&local_16c,frame_bb.Min.x + (pIVar1->Style).ItemInnerSpacing.x,
                       (float)local_8c._4_4_);
        RenderText(local_16c,label,(char *)0x0,true);
      }
    }
  }
  return;
}

Assistant:

void ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 frame_size)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (frame_size.x == 0.0f)
        frame_size.x = CalcItemWidth();
    if (frame_size.y == 0.0f)
        frame_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0, &frame_bb))
        return;
    const bool hovered = ItemHoverable(frame_bb, id);

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            if (v != v) // Ignore NaN values
                continue;
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    const int values_count_min = (plot_type == ImGuiPlotType_Lines) ? 2 : 1;
    if (values_count >= values_count_min)
    {
        int res_w = ImMin((int)frame_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
        int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

        // Tooltip on hover
        int v_hovered = -1;
        if (hovered && inner_bb.Contains(g.IO.MousePos))
        {
            const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
            const int v_idx = (int)(t * item_count);
            IM_ASSERT(v_idx >= 0 && v_idx < values_count);

            const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
            const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
            if (plot_type == ImGuiPlotType_Lines)
                SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx+1, v1);
            else if (plot_type == ImGuiPlotType_Histogram)
                SetTooltip("%d: %8.4g", v_idx, v0);
            v_hovered = v_idx;
        }

        const float t_step = 1.0f / (float)res_w;
        const float inv_scale = (scale_min == scale_max) ? 0.0f : (1.0f / (scale_max - scale_min));

        float v0 = values_getter(data, (0 + values_offset) % values_count);
        float t0 = 0.0f;
        ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) * inv_scale) );                       // Point in the normalized space of our target rectangle
        float histogram_zero_line_t = (scale_min * scale_max < 0.0f) ? (-scale_min * inv_scale) : (scale_min < 0.0f ? 0.0f : 1.0f);   // Where does the zero line stands

        const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
        const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

        for (int n = 0; n < res_w; n++)
        {
            const float t1 = t0 + t_step;
            const int v1_idx = (int)(t0 * item_count + 0.5f);
            IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
            const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
            const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) * inv_scale) );

            // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
            ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
            ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, histogram_zero_line_t));
            if (plot_type == ImGuiPlotType_Lines)
            {
                window->DrawList->AddLine(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
            }
            else if (plot_type == ImGuiPlotType_Histogram)
            {
                if (pos1.x >= pos0.x + 2.0f)
                    pos1.x -= 1.0f;
                window->DrawList->AddRectFilled(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
            }

            t0 = t1;
            tp0 = tp1;
        }
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f,0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);
}